

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Infoclr_nuke(void)

{
  infoclr *iclr;
  
  if (((byte)Infoclr->field_0x18 >> 5 & 1) != 0) {
    XFreeGC(Metadpy->dpy,Infoclr->gc);
  }
  Infoclr = (infoclr *)0x0;
  return 0;
}

Assistant:

static errr Infoclr_nuke(void)
{
	infoclr *iclr = Infoclr;

	/* Deal with 'GC' */
	if (iclr->nuke) {
		/* Free the GC */
		XFreeGC(Metadpy->dpy, iclr->gc);
	}

	/* Forget the current */
	Infoclr = (infoclr*)(NULL);

	/* Success */
	return (0);
}